

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int * tr_median3(int *ISAd,int *v1,int *v2,int *v3)

{
  int *t;
  int *v3_local;
  int *v2_local;
  int *v1_local;
  int *ISAd_local;
  int *local_8;
  
  v2_local = v2;
  v1_local = v1;
  if (ISAd[*v2] < ISAd[*v1]) {
    v2_local = v1;
    v1_local = v2;
  }
  if (ISAd[*v3] < ISAd[*v2_local]) {
    local_8 = v3;
    if (ISAd[*v3] < ISAd[*v1_local]) {
      local_8 = v1_local;
    }
  }
  else {
    local_8 = v2_local;
  }
  return local_8;
}

Assistant:

static INLINE
int *
tr_median3(const int *ISAd, int *v1, int *v2, int *v3) {
  int *t;
  if(ISAd[*v1] > ISAd[*v2]) { SWAP(v1, v2); }
  if(ISAd[*v2] > ISAd[*v3]) {
    if(ISAd[*v1] > ISAd[*v3]) { return v1; }
    else { return v3; }
  }
  return v2;
}